

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

void Cec_AddClausesMux(Cec_ManSat_t *p,Gia_Obj_t *pNode)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int pLits [4];
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  uint local_88;
  uint local_84;
  uint local_80;
  lit local_7c [2];
  uint local_74;
  Gia_Obj_t *local_70;
  Gia_Obj_t *local_68;
  uint local_60;
  uint local_5c;
  Gia_Obj_t *local_58;
  Gia_Obj_t *local_50;
  ulong local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x45,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  iVar7 = Gia_ObjIsMuxType(pNode);
  if (iVar7 == 0) {
    __assert_fail("Gia_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x46,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  local_50 = Gia_ObjRecognizeMux(pNode,&local_58,&local_68);
  pGVar5 = local_68;
  pGVar2 = p->pAig->pObjs;
  if ((((pGVar2 <= pNode) && (pGVar1 = pGVar2 + p->pAig->nObjs, pNode < pGVar1)) &&
      (pGVar2 <= local_50)) && (local_50 < pGVar1)) {
    pGVar9 = (Gia_Obj_t *)((ulong)local_58 & 0xfffffffffffffffe);
    if ((pGVar2 <= pGVar9) && (pGVar9 < pGVar1)) {
      pGVar8 = (Gia_Obj_t *)((ulong)local_68 & 0xfffffffffffffffe);
      if ((pGVar2 <= pGVar8) && (pGVar8 < pGVar1)) {
        piVar3 = p->pSatVars;
        local_38 = (ulong)(uint)piVar3[(int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2) *
                                       -0x55555555];
        local_48 = (ulong)(uint)piVar3[(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) *
                                       -0x55555555];
        uVar10 = (uint)local_58 & 1;
        uVar11 = piVar3[(int)((ulong)((long)local_50 - (long)pGVar2) >> 2) * -0x55555555] * 2 + 1;
        uVar4 = piVar3[(int)((ulong)((long)local_50 - (long)pGVar2) >> 2) * -0x55555555] * 2;
        local_60 = uVar10 + piVar3[(int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2) * -0x55555555] *
                            2;
        local_3c = local_60 ^ 1;
        local_74 = piVar3[(int)((ulong)((long)pNode - (long)pGVar2) >> 2) * -0x55555555] * 2;
        local_88 = uVar11;
        local_84 = local_3c;
        local_80 = local_74;
        if (p->pPars->fPolarFlip != 0) {
          if (*(long *)local_50 < 0) {
            local_88 = uVar4;
          }
          if (*(long *)pGVar9 < 0) {
            local_84 = local_60;
          }
          if (*(long *)pNode < 0) {
            local_80 = local_74 | 1;
          }
        }
        local_70 = pNode;
        iVar7 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
        pGVar2 = local_50;
        if (iVar7 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                        ,100,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
        }
        uVar10 = (int)local_38 * 2 | uVar10;
        local_5c = local_74 | 1;
        local_88 = uVar11;
        local_84 = uVar10;
        local_80 = local_5c;
        if (p->pPars->fPolarFlip != 0) {
          if (*(long *)local_50 < 0) {
            local_88 = uVar4;
          }
          if (*(long *)((ulong)local_58 & 0xfffffffffffffffe) < 0) {
            local_84 = uVar10 ^ 1;
          }
          if (*(long *)local_70 < 0) {
            local_80 = local_74;
          }
        }
        iVar7 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
        if (iVar7 != 0) {
          uVar12 = (uint)pGVar5 & 1;
          local_40 = uVar12 + (int)local_48 * 2;
          uVar11 = local_40 ^ 1;
          local_80 = local_74;
          local_88 = uVar4;
          local_84 = uVar11;
          if (p->pPars->fPolarFlip != 0) {
            if (*(long *)pGVar2 < 0) {
              local_88 = uVar4 | 1;
            }
            if (*(long *)((ulong)local_68 & 0xfffffffffffffffe) < 0) {
              local_84 = local_40;
            }
            if (*(long *)local_70 < 0) {
              local_80 = local_5c;
            }
          }
          iVar7 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
          uVar6 = local_5c;
          if (iVar7 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                          ,0x7a,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
          }
          uVar12 = (int)local_48 * 2 | uVar12;
          local_80 = local_5c;
          local_88 = uVar4;
          local_84 = uVar12;
          if (p->pPars->fPolarFlip != 0) {
            if (*(long *)local_50 < 0) {
              local_88 = uVar4 | 1;
            }
            if (*(long *)((ulong)local_68 & 0xfffffffffffffffe) < 0) {
              local_84 = uVar12 ^ 1;
            }
            if (*(long *)local_70 < 0) {
              local_80 = local_74;
            }
          }
          iVar7 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
          if (iVar7 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                          ,0x85,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
          }
          if ((int)local_38 != (int)local_48) {
            local_80 = uVar6;
            local_88 = uVar10;
            local_84 = uVar12;
            if (p->pPars->fPolarFlip != 0) {
              if (*(long *)((ulong)local_58 & 0xfffffffffffffffe) < 0) {
                local_88 = uVar10 ^ 1;
              }
              if (*(long *)((ulong)local_68 & 0xfffffffffffffffe) < 0) {
                local_84 = uVar12 ^ 1;
              }
              if (*(long *)local_70 < 0) {
                local_80 = local_74;
              }
            }
            iVar7 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
            if (iVar7 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                            ,0x9e,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
            }
            local_88 = local_3c;
            local_80 = local_74;
            local_84 = uVar11;
            if (p->pPars->fPolarFlip != 0) {
              if (*(long *)((ulong)local_58 & 0xfffffffffffffffe) < 0) {
                local_88 = local_60;
              }
              if (*(long *)((ulong)local_68 & 0xfffffffffffffffe) < 0) {
                local_84 = local_40;
              }
              if (*(long *)local_70 < 0) {
                local_80 = uVar6;
              }
            }
            iVar7 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
            if (iVar7 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                            ,0xa9,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
            }
          }
          return;
        }
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                      ,0x6f,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_AddClausesMux( Cec_ManSat_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Gia_IsComplement( pNode ) );
    assert( Gia_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Cec_ObjSatNum(p,pNode);
    VarI = Cec_ObjSatNum(p,pNodeI);
    VarT = Cec_ObjSatNum(p,Gia_Regular(pNodeT));
    VarE = Cec_ObjSatNum(p,Gia_Regular(pNodeE));
    // get the complementation flags
    fCompT = Gia_IsComplement(pNodeT);
    fCompE = Gia_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}